

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_config.hxx
# Opt level: O0

ptr<srv_config> __thiscall cornerstone::cluster_config::get_server(cluster_config *this,int id)

{
  bool bVar1;
  int32 iVar2;
  element_type *this_00;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  ptr<srv_config> pVar4;
  const_srv_itor it;
  list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  *in_stack_ffffffffffffffb8;
  element_type *this_01;
  _Self local_28;
  _Self local_20;
  int local_14;
  
  this_01 = in_RDI;
  local_14 = in_EDX;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  do {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
      std::shared_ptr<cornerstone::srv_config>::shared_ptr
                ((shared_ptr<cornerstone::srv_config> *)0x1c4870);
      _Var3._M_pi = extraout_RDX_00;
LAB_001c4870:
      pVar4.super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var3._M_pi;
      pVar4.super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (ptr<srv_config>)
             pVar4.super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_>::operator*
              ((_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_> *)this_01);
    this_00 = std::
              __shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c4831);
    iVar2 = srv_config::get_id(this_00);
    if (iVar2 == local_14) {
      std::_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_>::operator*
                ((_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_> *)this_01);
      std::shared_ptr<cornerstone::srv_config>::shared_ptr
                ((shared_ptr<cornerstone::srv_config> *)this_01,
                 (shared_ptr<cornerstone::srv_config> *)in_stack_ffffffffffffffb8);
      _Var3._M_pi = extraout_RDX;
      goto LAB_001c4870;
    }
    std::_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_>::operator++(&local_20);
  } while( true );
}

Assistant:

ptr<srv_config> get_server(int id) const
    {
        for (const_srv_itor it = servers_.begin(); it != servers_.end(); ++it)
        {
            if ((*it)->get_id() == id)
            {
                return *it;
            }
        }

        return ptr<srv_config>();
    }